

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMultiProcessHandler::CheckGeneratedResourceSpec(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  ostream *poVar7;
  bool bVar8;
  string error;
  ostringstream cmCTestLog_msg;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  p_Var5 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Properties).
            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  bVar8 = (_Rb_tree_header *)p_Var5 == p_Var1;
  if (!bVar8) {
    do {
      p_Var2 = p_Var5[1]._M_parent;
      if (p_Var2[0x1c]._M_left != (_Base_ptr)0x0) {
        if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload
            .super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property",0x42);
          std::ios::widen((char)(ostringstream *)local_1a8 +
                          (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x613,local_1e8._M_dataplus._M_p,false);
        }
        else if (p_Var2[0x16]._M_right == (_Base_ptr)&DAT_00000001) {
          bVar4 = cmsys::SystemTools::FileIsFullPath((string *)&p_Var2[0x1c]._M_parent);
          if (bVar4) {
            (this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload
            .super__Optional_payload_base<unsigned_long>._M_payload =
                 (_Storage<unsigned_long,_true>)(long)(int)p_Var5[1]._M_color;
            if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
              (this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>.
              _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
            }
            std::__cxx11::string::_M_assign((string *)&this->ResourceSpecSetupFixture);
            goto LAB_00299323;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"GENERATED_RESOURCE_SPEC_FILE must be an absolute path",
                     0x35);
          std::ios::widen((char)(ostringstream *)local_1a8 +
                          (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x623,local_1e8._M_dataplus._M_p,false);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Test that defines GENERATED_RESOURCE_SPEC_FILE must have exactly one FIXTURES_SETUP"
                     ,0x53);
          std::ios::widen((char)(ostringstream *)local_1a8 +
                          (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x61b,local_1e8._M_dataplus._M_p,false);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                   local_1e8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (!bVar8) goto LAB_00299801;
        break;
      }
LAB_00299323:
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      bVar8 = (_Rb_tree_header *)p_Var5 == p_Var1;
    } while (!bVar8);
  }
  if ((this->ResourceSpecSetupFixture)._M_string_length != 0) {
    p_Var5 = (this->Properties).
             super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar8 = (_Rb_tree_header *)p_Var5 == p_Var1;
    if (!bVar8) {
      do {
        p_Var2 = p_Var5[1]._M_parent;
        if ((p_Var2[0x1b]._M_left != p_Var2[0x1b]._M_right) &&
           (cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&p_Var2[0x18]._M_left,&this->ResourceSpecSetupFixture),
           cVar6._M_node == (_Base_ptr)&p_Var2[0x18]._M_right)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "All tests that have RESOURCE_GROUPS must include the resource spec generator fixture in their FIXTURES_REQUIRED"
                     ,0x6f);
          std::ios::widen((char)(ostringstream *)local_1a8 +
                          (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x634,local_1e8._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,
                            CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                     local_1e8.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          if (!bVar8) goto LAB_00299801;
          break;
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        bVar8 = (_Rb_tree_header *)p_Var5 == p_Var1;
      } while (!bVar8);
    }
  }
  if ((this->ResourceSpecFile)._M_string_length == 0) {
LAB_002997fd:
    bVar8 = true;
  }
  else {
    if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "GENERATED_RESOURCE_SPEC_FILE test property cannot be used in conjunction with ResourceSpecFile option"
                 ,0x65);
      std::ios::widen((char)(ostringstream *)local_1a8 +
                      (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x63f,local_1e8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    else {
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      bVar8 = InitResourceAllocator(this,&local_1e8);
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x644,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) goto LAB_002997fd;
    }
LAB_00299801:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckGeneratedResourceSpec()
{
  for (auto& test : this->Properties) {
    if (!test.second->GeneratedResourceSpecFile.empty()) {
      if (this->ResourceSpecSetupTest) {
        cmCTestLog(
          this->CTest, ERROR_MESSAGE,
          "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property"
            << std::endl);
        return false;
      }

      if (test.second->FixturesSetup.size() != 1) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Test that defines GENERATED_RESOURCE_SPEC_FILE must have "
                   "exactly one FIXTURES_SETUP"
                     << std::endl);
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(
            test.second->GeneratedResourceSpecFile)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "GENERATED_RESOURCE_SPEC_FILE must be an absolute path"
                     << std::endl);
        return false;
      }

      this->ResourceSpecSetupTest = test.first;
      this->ResourceSpecSetupFixture = *test.second->FixturesSetup.begin();
    }
  }

  if (!this->ResourceSpecSetupFixture.empty()) {
    for (auto& test : this->Properties) {
      if (!test.second->ResourceGroups.empty() &&
          !test.second->FixturesRequired.count(
            this->ResourceSpecSetupFixture)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "All tests that have RESOURCE_GROUPS must include the "
                   "resource spec generator fixture in their FIXTURES_REQUIRED"
                     << std::endl);
        return false;
      }
    }
  }

  if (!this->ResourceSpecFile.empty()) {
    if (this->ResourceSpecSetupTest) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "GENERATED_RESOURCE_SPEC_FILE test property cannot be used "
                 "in conjunction with ResourceSpecFile option"
                   << std::endl);
      return false;
    }
    std::string error;
    if (!this->InitResourceAllocator(error)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, error << std::endl);
      return false;
    }
  }

  return true;
}